

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O1

void __thiscall CEPlanet::copy_members(CEPlanet *this,CEPlanet *other)

{
  double dVar1;
  CEPlanet *this_00;
  
  dVar1 = other->mass_kg_;
  this->radius_m_ = other->radius_m_;
  this->mass_kg_ = dVar1;
  this->albedo_ = other->albedo_;
  if (other->reference_ != (CEPlanet *)0x0) {
    if (this->reference_ != (CEPlanet *)0x0) {
      (*(this->reference_->super_CEBody).super_CESkyCoord._vptr_CESkyCoord[1])();
      this->reference_ = (CEPlanet *)0x0;
    }
    this_00 = (CEPlanet *)operator_new(0x140);
    CEPlanet(this_00,other->reference_);
    this->reference_ = this_00;
  }
  this->algorithm_type_ = other->algorithm_type_;
  dVar1 = other->cached_jd_;
  this->sofa_planet_id_ = other->sofa_planet_id_;
  this->cached_jd_ = dVar1;
  std::vector<double,_std::allocator<double>_>::operator=(&this->pos_icrs_,&other->pos_icrs_);
  std::vector<double,_std::allocator<double>_>::operator=(&this->vel_icrs_,&other->vel_icrs_);
  dVar1 = other->eccentricity_;
  this->semi_major_axis_au_ = other->semi_major_axis_au_;
  this->eccentricity_ = dVar1;
  dVar1 = other->mean_longitude_deg_;
  this->inclination_deg_ = other->inclination_deg_;
  this->mean_longitude_deg_ = dVar1;
  dVar1 = other->ascending_node_lon_deg_;
  this->perihelion_lon_deg_ = other->perihelion_lon_deg_;
  this->ascending_node_lon_deg_ = dVar1;
  dVar1 = other->eccentricity_per_cent_;
  this->semi_major_axis_au_per_cent_ = other->semi_major_axis_au_per_cent_;
  this->eccentricity_per_cent_ = dVar1;
  dVar1 = other->mean_longitude_deg_per_cent_;
  this->inclination_deg_per_cent_ = other->inclination_deg_per_cent_;
  this->mean_longitude_deg_per_cent_ = dVar1;
  dVar1 = other->ascending_node_lon_deg_per_cent_;
  this->perihelion_long_deg_per_cent_ = other->perihelion_long_deg_per_cent_;
  this->ascending_node_lon_deg_per_cent_ = dVar1;
  dVar1 = other->b_;
  this->E_tol = other->E_tol;
  this->b_ = dVar1;
  dVar1 = other->s_;
  this->c_ = other->c_;
  this->s_ = dVar1;
  this->f_ = other->f_;
  return;
}

Assistant:

void CEPlanet::copy_members(const CEPlanet& other)
{
    // Basic properties
    radius_m_ = other.radius_m_;
    mass_kg_  = other.mass_kg_;
    albedo_   = other.albedo_;
    
    // The following is a reference point for the observer
    // This will almost always be the Earth-Moon barycenter
    if (other.reference_ != nullptr) {
        if (reference_ != nullptr) {
            delete reference_;
            reference_ = nullptr;
        }
        reference_ = new CEPlanet(*other.reference_);
    }

    // Define the algorithm used to compute the planets position
    algorithm_type_ = other.algorithm_type_;
    /// Sofa planet id (note: 3.5 implies the earth-center which uses a different method
    /// than the other planets)
    sofa_planet_id_ = other.sofa_planet_id_;
    
    // The coordinates representing the current position will need to be
    // relative to some date, since planets move. This is the cached date
    cached_jd_ = other.cached_jd_;
    pos_icrs_  = other.pos_icrs_;
    vel_icrs_  = other.vel_icrs_;
    
    /******************************************
     * Properties for the JPL algorithm
     ******************************************/
    // Orbital properties (element 2 is the derivative)
    semi_major_axis_au_     = other.semi_major_axis_au_;
    eccentricity_           = other.eccentricity_;
    inclination_deg_        = other.inclination_deg_;
    mean_longitude_deg_     = other.mean_longitude_deg_;
    perihelion_lon_deg_     = other.perihelion_lon_deg_;
    ascending_node_lon_deg_ = other.ascending_node_lon_deg_;
    
    // Derivatives of orbital properties
    semi_major_axis_au_per_cent_     = other.semi_major_axis_au_per_cent_;
    eccentricity_per_cent_           = other.eccentricity_per_cent_;
    inclination_deg_per_cent_        = other.inclination_deg_per_cent_;
    mean_longitude_deg_per_cent_     = other.mean_longitude_deg_per_cent_;
    perihelion_long_deg_per_cent_    = other.perihelion_long_deg_per_cent_;
    ascending_node_lon_deg_per_cent_ = other.ascending_node_lon_deg_per_cent_;
    
    // The following is the tolerance for the computation of eccentric anomoly
    E_tol = other.E_tol;
    
    // Extra terms for outer planets (Jupiter, Saturn, Uranus, Neptune, and Pluto)
    b_ = other.b_;
    c_ = other.c_;
    s_ = other.s_;
    f_ = other.f_;
}